

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.h
# Opt level: O2

hash_type __thiscall libchess::Position::calculate_hash(Position *this)

{
  Color color;
  PieceType piece_type;
  pointer pSVar1;
  _Optional_payload<libchess::Square,_true,_true,_true> _Var2;
  long lVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  uVar7 = 0;
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 4) {
    color.super_MetaValueType<int>.value_ =
         (MetaValueType<int>)((MetaValueType<int> *)((long)&constants::COLORS + lVar5))->value_;
    for (lVar8 = 0; lVar8 != 0x18; lVar8 = lVar8 + 4) {
      piece_type.super_MetaValueType<int>.value_ =
           (MetaValueType<int>)
           ((MetaValueType<int> *)((long)&constants::PIECE_TYPES + lVar8))->value_;
      for (uVar6 = this->piece_type_bb_[(int)piece_type.super_MetaValueType<int>.value_].value_ &
                   this->color_bb_[(int)color.super_MetaValueType<int>.value_].value_; uVar6 != 0;
          uVar6 = uVar6 & uVar6 - 1) {
        lVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> lVar3 & 1) == 0; lVar3 = lVar3 + 1) {
          }
        }
        uVar4 = zobrist::piece_square_key((MetaValueType<int>)(value_type)lVar3,piece_type,color);
        uVar7 = uVar7 ^ uVar4;
      }
    }
  }
  pSVar1 = (this->history_).
           super__Vector_base<libchess::Position::State,_std::allocator<libchess::Position::State>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2.super__Optional_payload_base<libchess::Square> =
       pSVar1[this->ply_].enpassant_square_.super__Optional_base<libchess::Square,_true,_true>.
       _M_payload.super__Optional_payload_base<libchess::Square>;
  if (((ulong)_Var2.super__Optional_payload_base<libchess::Square> >> 0x20 & 1) != 0) {
    uVar7 = uVar7 ^ *(ulong *)(polyglot::random_u64 +
                              (ulong)((uint)_Var2.super__Optional_payload_base<libchess::Square>.
                                            _M_payload & 7) * 8 + 0x1820);
  }
  uVar4 = zobrist::castling_rights_key((CastlingRights)pSVar1[this->ply_].castling_rights_.value_);
  return uVar4 ^ uVar7 ^
         *(ulong *)(polyglot::random_u64 +
                   (long)(this->side_to_move_).super_MetaValueType<int>.value_ * 8 + 0x1860);
}

Assistant:

hash_type calculate_hash() const {
        hash_type hash_value = 0;
        for (Color c : constants::COLORS) {
            for (PieceType pt : constants::PIECE_TYPES) {
                Bitboard bb = piece_type_bb(pt, c);
                while (bb) {
                    hash_value ^= zobrist::piece_square_key(bb.forward_bitscan(), pt, c);
                    bb.forward_popbit();
                }
            }
        }
        auto ep_sq = enpassant_square();
        if (ep_sq) {
            hash_value ^= zobrist::enpassant_key(*ep_sq);
        }
        hash_value ^= zobrist::castling_rights_key(castling_rights());
        hash_value ^= zobrist::side_to_move_key(side_to_move());
        return hash_value;
    }